

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

void __thiscall
TasGrid::TasmanianSparseGrid::makeGlobalGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *anisotropic_weights,double alpha,
          double beta,char *custom_filename,vector<int,_std::allocator<int>_> *level_limits)

{
  pointer piVar1;
  pointer piVar2;
  BaseCanonicalGrid *pBVar3;
  vector<int,_std::allocator<int>_> *__x;
  BaseCanonicalGrid *pBVar4;
  bool bVar5;
  invalid_argument *this_00;
  byte bVar6;
  TypeOneDRule rule_local;
  TypeDepth type_local;
  int dimensions_local;
  int depth_local;
  int outputs_local;
  BaseCanonicalGrid *local_48;
  double beta_local;
  double alpha_local;
  _Head_base<0UL,_TasGrid::AccelerationContext_*,_false> local_30;
  
  rule_local = rule;
  type_local = type;
  dimensions_local = dimensions;
  depth_local = depth;
  outputs_local = outputs;
  beta_local = beta;
  alpha_local = alpha;
  if (dimensions < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_00,"ERROR: makeGlobalGrid() requires positive dimensions");
  }
  else if (outputs < 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_00,"ERROR: makeGlobalGrid() requires non-negative outputs");
  }
  else if (depth < 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (this_00,"ERROR: makeGlobalGrid() requires non-negative depth");
  }
  else {
    bVar5 = OneDimensionalMeta::isGlobal(rule);
    __x = level_limits;
    if (bVar5) {
      if ((rule_local == rule_customtabulated) && (custom_filename == (char *)0x0)) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::invalid_argument::invalid_argument
                  (this_00,"ERROR: makeGlobalGrid() with custom tabulated rule requires a filename")
        ;
      }
      else {
        bVar6 = 0;
        if (type_local - type_curved < 6) {
          bVar6 = (byte)*(undefined4 *)(&DAT_001cc024 + (ulong)(type_local - type_curved) * 4);
        }
        piVar1 = (anisotropic_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = (anisotropic_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((piVar1 == piVar2) ||
           ((long)piVar2 - (long)piVar1 >> 2 == (long)dimensions_local << (bVar6 & 0x3f))) {
          piVar1 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((piVar1 == piVar2) || ((long)piVar2 - (long)piVar1 >> 2 == (long)dimensions_local)) {
            clear(this);
            ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,__x);
            local_30._M_head_impl =
                 (this->acceleration)._M_t.
                 super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                 .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl;
            Utils::
            make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext*,int&,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,double&,double&,char_const*&,std::vector<int,std::allocator<int>>&>
                      ((Utils *)&local_48,&local_30._M_head_impl,&dimensions_local,&outputs_local,
                       &depth_local,&type_local,&rule_local,anisotropic_weights,&alpha_local,
                       &beta_local,&custom_filename,&this->llimits);
            pBVar4 = local_48;
            local_48 = (BaseCanonicalGrid *)0x0;
            pBVar3 = (this->base)._M_t.
                     super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                     .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
            (this->base)._M_t.
            super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl = pBVar4;
            if (pBVar3 != (BaseCanonicalGrid *)0x0) {
              (*pBVar3->_vptr_BaseCanonicalGrid[1])();
            }
            if (local_48 != (BaseCanonicalGrid *)0x0) {
              (**(code **)(*(long *)local_48 + 8))();
            }
            return;
          }
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument
                    (this_00,
                     "ERROR: makeGlobalGrid() requires level_limits with either 0 or dimensions entries"
                    );
        }
        else {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument
                    (this_00,
                     "ERROR: makeGlobalGrid() requires anisotropic_weights with either 0 or dimenions entries"
                    );
        }
      }
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (this_00,"ERROR: makeGlobalGrid() requires a global rule");
    }
  }
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void TasmanianSparseGrid::makeGlobalGrid(int dimensions, int outputs, int depth, TypeDepth type, TypeOneDRule rule, const std::vector<int> &anisotropic_weights, double alpha, double beta, const char* custom_filename, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeGlobalGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeGlobalGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeGlobalGrid() requires non-negative depth");
    if (!OneDimensionalMeta::isGlobal(rule)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires a global rule");
    if ((rule == rule_customtabulated) && (custom_filename == 0)) throw std::invalid_argument("ERROR: makeGlobalGrid() with custom tabulated rule requires a filename");
    size_t expected_aw_size = (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions;
    if ((!anisotropic_weights.empty()) && (anisotropic_weights.size() != expected_aw_size)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires anisotropic_weights with either 0 or dimenions entries");
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeGlobalGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridGlobal>(acceleration.get(), dimensions, outputs, depth, type, rule, anisotropic_weights, alpha, beta, custom_filename, llimits);
}